

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_acl_text(archive_entry *entry,wchar_t flags)

{
  wchar_t wVar1;
  int *piVar2;
  char *local_20;
  char *p;
  archive_entry *paStack_10;
  wchar_t flags_local;
  archive_entry *entry_local;
  
  p._4_4_ = flags;
  paStack_10 = entry;
  wVar1 = archive_acl_text_l(&entry->acl,flags,&local_20,(size_t *)0x0,(archive_string_conv *)0x0);
  if (wVar1 != L'\0') {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
  }
  return local_20;
}

Assistant:

const char *
archive_entry_acl_text(struct archive_entry *entry, int flags)
{
	const char *p;
	if (archive_acl_text_l(&entry->acl, flags, &p, NULL, NULL) != 0
	    && errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (p);
}